

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode Curl_smtp_escape_eob(connectdata *conn,ssize_t nread)

{
  SessionHandle *data_00;
  void *pvVar1;
  char *pcVar2;
  SMTP *smtp;
  SessionHandle *data;
  ssize_t si;
  ssize_t i;
  ssize_t nread_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  if ((data_00->state).scratch == (char *)0x0) {
    pcVar2 = (char *)(*Curl_cmalloc)(0x8000);
    (data_00->state).scratch = pcVar2;
    if ((data_00->state).scratch == (char *)0x0) {
      Curl_failf(data_00,"Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }
  data = (SessionHandle *)0x0;
  for (si = 0; si < nread; si = si + 1) {
    if ("\r\n.\r\n"[*(long *)((long)pvVar1 + 0x18)] == (data_00->req).upload_fromhere[si]) {
      *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) + 1;
      if ((*(long *)((long)pvVar1 + 0x18) == 2) || (*(long *)((long)pvVar1 + 0x18) == 5)) {
        *(undefined1 *)((long)pvVar1 + 0x20) = 1;
      }
      else {
        *(undefined1 *)((long)pvVar1 + 0x20) = 0;
      }
    }
    else if (*(long *)((long)pvVar1 + 0x18) != 0) {
      memcpy((data_00->state).scratch + (long)data,"\r\n.\r\n",*(size_t *)((long)pvVar1 + 0x18));
      data = (SessionHandle *)((long)data->sockets + *(long *)((long)pvVar1 + 0x18) + -0x38);
      if ((data_00->req).upload_fromhere[si] == '\r') {
        *(undefined8 *)((long)pvVar1 + 0x18) = 1;
      }
      else {
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
      }
      *(undefined1 *)((long)pvVar1 + 0x20) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x18) == 3) {
      builtin_strncpy((data_00->state).scratch + (long)data,"\r\n..",4);
      *(undefined8 *)((long)pvVar1 + 0x18) = 0;
      data = (SessionHandle *)((long)&data->next + 4);
    }
    else if (*(long *)((long)pvVar1 + 0x18) == 0) {
      (data_00->state).scratch[(long)data] = (data_00->req).upload_fromhere[si];
      data = (SessionHandle *)((long)&data->next + 1);
    }
  }
  if (*(long *)((long)pvVar1 + 0x18) != 0) {
    memcpy((data_00->state).scratch + (long)data,"\r\n.\r\n",*(size_t *)((long)pvVar1 + 0x18));
    data = (SessionHandle *)((long)data->sockets + *(long *)((long)pvVar1 + 0x18) + -0x38);
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  }
  if (data != (SessionHandle *)nread) {
    (data_00->req).upload_fromhere = (data_00->state).scratch;
    (data_00->req).upload_present = (ssize_t)data;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_smtp_escape_eob(struct connectdata *conn, ssize_t nread)
{
  /* When sending a SMTP payload we must detect CRLF. sequences making sure
     they are sent as CRLF.. instead, as a . on the beginning of a line will
     be deleted by the server when not part of an EOB terminator and a
     genuine CRLF.CRLF which isn't escaped will wrongly be detected as end of
     data by the server
  */
  ssize_t i;
  ssize_t si;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Do we need to allocate the scatch buffer? */
  if(!data->state.scratch) {
    data->state.scratch = malloc(2 * BUFSIZE);

    if(!data->state.scratch) {
      failf (data, "Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* This loop can be improved by some kind of Boyer-Moore style of
     approach but that is saved for later... */
  for(i = 0, si = 0; i < nread; i++) {
    if(SMTP_EOB[smtp->eob] == data->req.upload_fromhere[i]) {
      smtp->eob++;

      /* Is the EOB potentially the terminating CRLF? */
      if(2 == smtp->eob || SMTP_EOB_LEN == smtp->eob)
        smtp->trailing_crlf = TRUE;
      else
        smtp->trailing_crlf = FALSE;
    }
    else if(smtp->eob) {
      /* A previous substring matched so output that first */
      memcpy(&data->state.scratch[si], SMTP_EOB, smtp->eob);
      si += smtp->eob;

      /* Then compare the first byte */
      if(SMTP_EOB[0] == data->req.upload_fromhere[i])
        smtp->eob = 1;
      else
        smtp->eob = 0;

      /* Reset the trailing CRLF flag as there was more data */
      smtp->trailing_crlf = FALSE;
    }

    /* Do we have a match for CRLF. as per RFC-5321, sect. 4.5.2 */
    if(SMTP_EOB_FIND_LEN == smtp->eob) {
      /* Copy the replacement data to the target buffer */
      memcpy(&data->state.scratch[si], SMTP_EOB_REPL, SMTP_EOB_REPL_LEN);
      si += SMTP_EOB_REPL_LEN;
      smtp->eob = 0;
    }
    else if(!smtp->eob)
      data->state.scratch[si++] = data->req.upload_fromhere[i];
  }

  if(smtp->eob) {
    /* A substring matched before processing ended so output that now */
    memcpy(&data->state.scratch[si], SMTP_EOB, smtp->eob);
    si += smtp->eob;
    smtp->eob = 0;
  }

  if(si != nread) {
    /* Only use the new buffer if we replaced something */
    nread = si;

    /* Upload from the new (replaced) buffer instead */
    data->req.upload_fromhere = data->state.scratch;

    /* Set the new amount too */
    data->req.upload_present = nread;
  }

  return CURLE_OK;
}